

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O3

void __thiscall
cfd::core::ElementsConfidentialAddress::DecodeAddress
          (ElementsConfidentialAddress *this,string *confidential_address,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list)

{
  pointer pcVar1;
  pointer puVar2;
  string *psVar3;
  _Alloc_hider _Var4;
  value_type_conflict1 *__val;
  CfdException *pCVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *wally_string;
  string *key;
  bool bVar6;
  pointer this_00;
  int ret;
  uint32_t prefix;
  char *output;
  string hrp;
  string address;
  int local_2a4;
  string *local_2a0;
  uint local_294;
  WallyUtil *local_290;
  pointer local_288;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_280;
  ElementsConfidentialAddress *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  CfdSourceLocation local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  pointer local_220;
  string *local_218;
  _func_int **local_210;
  pointer local_208;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  local_200;
  string local_1e8;
  undefined1 local_1c8 [8];
  pointer puStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  uchar local_1a8 [16];
  pointer local_198;
  pointer local_180;
  pointer local_168;
  TapBranch local_150;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_d8;
  Script local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  ByteData local_48;
  
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x21);
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x21;
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_290 = (WallyUtil *)0x0;
  local_2a0 = confidential_address;
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (confidential_address->_M_string_length == 0) {
    local_1c8 = (undefined1  [8])0x21ecf7;
    puStack_1c0 = (pointer)CONCAT44(puStack_1c0._4_4_,0x83);
    local_1b8._M_allocated_capacity = 0x21bf0b;
    logger::log<std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
               "DecodeAddress error. confidential address empty. : address={}.",confidential_address
              );
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1c8 = (undefined1  [8])&local_1b8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"DecodeAddress confidential address empty.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1c8);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_2a4 = -1;
  local_294 = 0;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  this_00 = (prefix_list->
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_220 = (prefix_list->
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_220) {
    local_218 = (string *)&this->address_;
    bVar6 = false;
    local_210 = (_func_int **)&PTR__TaprootScriptTree_00259f80;
    local_268 = this;
    do {
      GetBlindKeyPair();
      local_208 = local_200.
                  super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_200.
          super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_200.
          super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        key = &(local_200.
                super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                ._M_impl.super__Vector_impl_data._M_start)->blinded_prefix_key;
        local_288 = this_00;
        do {
          local_290 = (WallyUtil *)0x0;
          if (*(char *)&key[1]._M_dataplus._M_p == '\x01') {
            AddressFormatData::GetString((string *)local_1c8,this_00,key);
            ::std::__cxx11::string::operator=((string *)&local_240,(string *)local_1c8);
            if (local_1c8 != (undefined1  [8])&local_1b8) {
              operator_delete((void *)local_1c8);
            }
            local_2a4 = wally_confidential_addr_segwit_to_ec_public_key
                                  ((local_2a0->_M_dataplus)._M_p,local_240._M_dataplus._M_p,
                                   local_280.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            if (local_2a4 == 0) goto LAB_001ddded;
            local_1c8 = (undefined1  [8])0x21ecf7;
            puStack_1c0._0_4_ = 0x9c;
            local_1b8._M_allocated_capacity = 0x21bf0b;
            logger::log<int&,std::__cxx11::string&>
                      ((CfdSourceLocation *)local_1c8,kCfdLogLevelTrace,
                       "fail libwally. ret={} prefix={}",&local_2a4,&local_240);
            local_1c8 = (undefined1  [8])0x21ecf7;
            puStack_1c0 = (pointer)CONCAT44(puStack_1c0._4_4_,0x9e);
            local_1b8._M_allocated_capacity = 0x21bf0b;
            logger::log<std::__cxx11::string_const&>
                      ((CfdSourceLocation *)local_1c8,kCfdLogLevelTrace,"confidential_address={}",
                       local_2a0);
LAB_001dddda:
            this_00 = local_288;
            if (local_2a4 == 0) goto LAB_001ddded;
          }
          else {
            local_294 = AddressFormatData::GetValue(this_00,key);
            local_2a4 = wally_confidential_addr_to_ec_public_key
                                  ((local_2a0->_M_dataplus)._M_p,local_294,
                                   local_280.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            if (local_2a4 != 0) {
              local_1c8 = (undefined1  [8])0x21ecf7;
              puStack_1c0._0_4_ = 0xa9;
              local_1b8._M_allocated_capacity = 0x21bf0b;
              logger::log<int&,unsigned_int&>
                        ((CfdSourceLocation *)local_1c8,kCfdLogLevelTrace,
                         "fail libwally. ret={} prefix={}",&local_2a4,&local_294);
              local_1c8 = (undefined1  [8])0x21ecf7;
              puStack_1c0 = (pointer)CONCAT44(puStack_1c0._4_4_,0xac);
              local_1b8._M_allocated_capacity = 0x21bf0b;
              logger::log<std::__cxx11::string_const&>
                        ((CfdSourceLocation *)local_1c8,kCfdLogLevelTrace,"confidential_address={}",
                         local_2a0);
              goto LAB_001dddda;
            }
LAB_001ddded:
            _Var4._M_p = local_240._M_dataplus._M_p;
            pcVar1 = (local_2a0->_M_dataplus)._M_p;
            if (*(char *)&key[1]._M_dataplus._M_p == '\x01') {
              AddressFormatData::GetString((string *)local_1c8,this_00,key + -1);
              local_2a4 = wally_confidential_addr_to_addr_segwit
                                    (pcVar1,_Var4._M_p,local_1c8,&local_290);
              wally_string = extraout_RDX;
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8);
                wally_string = extraout_RDX_00;
              }
              if (local_2a4 != 0) {
                local_258.filename = "cfdcore_elements_address.cpp";
                local_258.line = 0xb9;
                local_258.funcname = "DecodeAddress";
                AddressFormatData::GetString((string *)local_1c8,this_00,key + -1);
                local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8;
                logger::log<int&,char_const*&>
                          (&local_258,kCfdLogLevelTrace,"fail libwally. ret={} prefix={}",&local_2a4
                           ,(char **)&local_260);
                wally_string = extraout_RDX_01;
                if (local_1c8 != (undefined1  [8])&local_1b8) {
                  operator_delete((void *)local_1c8);
                  wally_string = extraout_RDX_02;
                }
              }
            }
            else {
              local_2a4 = wally_confidential_addr_to_addr(pcVar1,local_294,&local_290);
              wally_string = extraout_RDX_03;
              if (local_2a4 == 0) goto LAB_001ddf6e;
              local_1c8 = (undefined1  [8])0x21ecf7;
              puStack_1c0 = (pointer)CONCAT44(puStack_1c0._4_4_,0xc1);
              local_1b8._M_allocated_capacity = 0x21bf0b;
              logger::log<int&,unsigned_int&>
                        ((CfdSourceLocation *)local_1c8,kCfdLogLevelTrace,
                         "fail libwally. ret={} prefix={}",&local_2a4,&local_294);
              wally_string = extraout_RDX_04;
            }
            this = local_268;
            if (local_2a4 == 0) {
LAB_001ddf6e:
              WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_1c8,local_290,wally_string)
              ;
              ::std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8);
              }
              core::Address::Address((Address *)local_1c8,&local_1e8,this_00);
              core::Address::operator=(&this->unblinded_address_,(Address *)local_1c8);
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_80);
              Script::~Script(&local_c0);
              local_150._vptr_TapBranch = local_210;
              ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
              ~vector(&local_d8);
              TapBranch::~TapBranch(&local_150);
              if (local_168 != (pointer)0x0) {
                operator_delete(local_168);
              }
              if (local_180 != (pointer)0x0) {
                operator_delete(local_180);
              }
              if (local_198 != (pointer)0x0) {
                operator_delete(local_198);
              }
              if ((uchar *)local_1b8._M_allocated_capacity != local_1a8) {
                operator_delete((void *)local_1b8._M_allocated_capacity);
              }
              ByteData::ByteData(&local_48,&local_280);
              Pubkey::Pubkey((Pubkey *)local_1c8,&local_48);
              puVar2 = (this->confidential_key_).data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              (this->confidential_key_).data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_1c8;
              (this->confidential_key_).data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = puStack_1c0;
              (this->confidential_key_).data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._M_allocated_capacity;
              local_1c8 = (undefined1  [8])0x0;
              puStack_1c0 = (pointer)0x0;
              local_1b8._M_allocated_capacity = 0;
              if ((puVar2 != (pointer)0x0) &&
                 (operator_delete(puVar2), local_1c8 != (undefined1  [8])0x0)) {
                operator_delete((void *)local_1c8);
              }
              if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              ::std::__cxx11::string::_M_assign(local_218);
              ::std::
              vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
              ::~vector(&local_200);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p);
              }
              if (local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_280.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              return;
            }
          }
          bVar6 = true;
          psVar3 = key + 1;
          key = (string *)&key[2]._M_string_length;
        } while ((pointer)&psVar3->_M_string_length != local_208);
      }
      ::std::
      vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ::~vector(&local_200);
      this_00 = this_00 + 1;
    } while (this_00 != local_220);
    if (bVar6) {
      local_1c8 = (undefined1  [8])0x21ecf7;
      puStack_1c0 = (pointer)CONCAT44(puStack_1c0._4_4_,0xd8);
      local_1b8._M_allocated_capacity = 0x21bf0b;
      logger::log<std::__cxx11::string_const&>
                ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                 "DecodeAddress error. ConfidentialAddress prefix not found. : address={}.",
                 local_2a0);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1c8 = (undefined1  [8])&local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"DecodeAddress confidential address prefix not found.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  local_1c8 = (undefined1  [8])0x21ecf7;
  puStack_1c0 = (pointer)CONCAT44(puStack_1c0._4_4_,0xe1);
  local_1b8._M_allocated_capacity = 0x21bf0b;
  logger::log<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
             "DecodeAddress error. ConfidentialAddress prefix not registed. : address={}.",local_2a0
            );
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1c8 = (undefined1  [8])&local_1b8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"DecodeAddress confidential address prefix not registed.","");
  CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1c8);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ElementsConfidentialAddress::DecodeAddress(
    const std::string& confidential_address,
    const std::vector<AddressFormatData>& prefix_list) {
  std::vector<uint8_t> pubkey_data(Pubkey::kCompressedPubkeySize);
  std::string address;
  char* output = nullptr;

  if (confidential_address.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. confidential address empty."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError, "DecodeAddress confidential address empty.");
  }

  int ret = -1;
  uint32_t prefix = 0;
  std::string hrp;
  bool is_find_blinded_prefix = false;
  for (const auto& data : prefix_list) {
    for (const auto& format : GetBlindKeyPair()) {
      try {
        output = nullptr;

        // Get confidential_key
        if (format.is_segwit) {
          hrp = data.GetString(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_segwit_to_ec_public_key(
              confidential_address.c_str(), hrp.c_str(), pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret, hrp);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        } else {
          prefix = data.GetValue(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_to_ec_public_key(
              confidential_address.c_str(), prefix, pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        }

        if (ret != WALLY_OK) {
          // do nothing
        } else if (format.is_segwit) {
          ret = wally_confidential_addr_to_addr_segwit(
              confidential_address.c_str(), hrp.c_str(),
              data.GetString(format.prefix_key).c_str(), &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                data.GetString(format.prefix_key).c_str());
          }
        } else {
          ret = wally_confidential_addr_to_addr(
              confidential_address.c_str(), prefix, &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
          }
        }

        if (ret == WALLY_OK) {
          address = WallyUtil::ConvertStringAndFree(output);
          unblinded_address_ = Address(address, data);
          confidential_key_ = ConfidentialKey(ByteData(pubkey_data));
          address_ = confidential_address;
          return;
        }
      } catch (const CfdException& except) {
        // Ignore
        trace(
            CFD_LOG_SOURCE, "DecodeAddress exception={}",
            std::string(except.what()));
      }
    }
  }

  if (is_find_blinded_prefix) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not found."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not found.");
  } else {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not registed."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not registed.");
  }
}